

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::applyScaling(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  pointer pnVar5;
  pointer pnVar6;
  long lVar7;
  type_conflict5 tVar8;
  double *pdVar9;
  long lVar10;
  Item *pIVar11;
  int j;
  long lVar12;
  cpp_dec_float<50U,_int,_void> local_268;
  long local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  int local_200;
  undefined1 local_1fc;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  int local_180;
  undefined1 local_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined1 local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  local_230 = 0;
  while (local_230 <
         (lp->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum) {
    pIVar11 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_230].idx;
    uVar3 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).scaleExp.data[local_230];
    lVar10 = 0x30;
    for (lVar12 = 0; lVar7 = local_230,
        lVar12 < (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar12 = lVar12 + 1) {
      pNVar4 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x30);
      local_68 = *puVar1;
      uStack_60 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x20);
      local_58 = *puVar1;
      uStack_50 = puVar1[1];
      local_48 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x10);
      local_40 = *(undefined4 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -8);
      local_3c = *(undefined1 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -4);
      local_38 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_68,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)((lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp.data
                            [*(int *)((long)&(pNVar4->val).m_backend.data + lVar10 + 8)] + uVar3),
                 CONCAT31((int3)((uint)local_40 >> 8),local_3c));
      pNVar4 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x10) =
           local_268.data._M_elems._32_8_;
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x20);
      *puVar1 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      puVar1[1] = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x30);
      *puVar1 = CONCAT44(local_268.data._M_elems[1],local_268.data._M_elems[0]);
      puVar1[1] = CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
      *(int *)((long)&(pNVar4->val).m_backend.data + lVar10 + -8) = local_268.exp;
      *(bool *)((long)&(pNVar4->val).m_backend.data + lVar10 + -4) = local_268.neg;
      *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10) = local_268._48_8_;
      lVar10 = lVar10 + 0x3c;
    }
    pnVar5 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = *(undefined8 *)((long)&pnVar5[local_230].m_backend.data + 0x20);
    local_a8 = *(undefined8 *)&pnVar5[local_230].m_backend.data;
    uStack_a0 = *(undefined8 *)((long)&pnVar5[local_230].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar5[local_230].m_backend.data + 0x10);
    local_98 = *(undefined8 *)puVar2;
    uStack_90 = *(undefined8 *)(puVar2 + 2);
    local_80 = pnVar5[local_230].m_backend.exp;
    local_7c = pnVar5[local_230].m_backend.neg;
    local_78._0_4_ = pnVar5[local_230].m_backend.fpclass;
    local_78._4_4_ = pnVar5[local_230].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_268,(soplex *)&local_a8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)uVar3,CONCAT31((int3)((uint)local_80 >> 8),local_7c));
    pnVar6 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar6[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
    puVar2 = (uint *)((long)&pnVar6[lVar7].m_backend.data + 0x10);
    *puVar2 = local_268.data._M_elems[4];
    puVar2[1] = local_268.data._M_elems[5];
    puVar2[2] = local_268.data._M_elems[6];
    puVar2[3] = local_268.data._M_elems[7];
    pnVar5 = pnVar6 + lVar7;
    (pnVar5->m_backend).data._M_elems[0] = local_268.data._M_elems[0];
    *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_268.data._M_elems[1];
    *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_268.data._M_elems[2];
    *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_268.data._M_elems[3];
    pnVar6[lVar7].m_backend.exp = local_268.exp;
    pnVar6[lVar7].m_backend.neg = local_268.neg;
    pnVar6[lVar7].m_backend.fpclass = local_268.fpclass;
    pnVar6[lVar7].m_backend.prec_elem = local_268.prec_elem;
    pnVar5 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_268,*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator<
                      (pnVar5 + lVar7,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268);
    if (tVar8) {
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c8 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20);
      local_e8 = *(undefined8 *)&pnVar5[lVar7].m_backend.data;
      uStack_e0 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      local_d8 = *(undefined8 *)puVar2;
      uStack_d0 = *(undefined8 *)(puVar2 + 2);
      local_c0 = pnVar5[lVar7].m_backend.exp;
      local_bc = pnVar5[lVar7].m_backend.neg;
      local_b8._0_4_ = pnVar5[lVar7].m_backend.fpclass;
      local_b8._4_4_ = pnVar5[lVar7].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_e8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)uVar3,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
      pnVar6 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar6[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar6[lVar7].m_backend.data + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      pnVar5 = pnVar6 + lVar7;
      (pnVar5->m_backend).data._M_elems[0] = local_268.data._M_elems[0];
      *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_268.data._M_elems[1];
      *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_268.data._M_elems[2];
      *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_268.data._M_elems[3];
      pnVar6[lVar7].m_backend.exp = local_268.exp;
      pnVar6[lVar7].m_backend.neg = local_268.neg;
      pnVar6[lVar7].m_backend.fpclass = local_268.fpclass;
      pnVar6[lVar7].m_backend.prec_elem = local_268.prec_elem;
    }
    pnVar5 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_268,-*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator>
                      (pnVar5 + lVar7,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268);
    if (tVar8) {
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_108 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20);
      local_128 = *(undefined8 *)&pnVar5[lVar7].m_backend.data;
      uStack_120 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      local_118 = *(undefined8 *)puVar2;
      uStack_110 = *(undefined8 *)(puVar2 + 2);
      local_100 = pnVar5[lVar7].m_backend.exp;
      local_fc = pnVar5[lVar7].m_backend.neg;
      local_f8._0_4_ = pnVar5[lVar7].m_backend.fpclass;
      local_f8._4_4_ = pnVar5[lVar7].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)uVar3,CONCAT31((int3)((uint)local_100 >> 8),local_fc));
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      *(ulong *)&pnVar5[lVar7].m_backend.data =
           CONCAT44(local_268.data._M_elems[1],local_268.data._M_elems[0]);
      *(ulong *)((long)&pnVar5[lVar7].m_backend.data + 8) =
           CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
      pnVar5[lVar7].m_backend.exp = local_268.exp;
      pnVar5[lVar7].m_backend.neg = local_268.neg;
      pnVar5[lVar7].m_backend.fpclass = local_268.fpclass;
      pnVar5[lVar7].m_backend.prec_elem = local_268.prec_elem;
    }
    local_230 = lVar7 + 1;
  }
  local_230 = 0;
  while (local_230 <
         (lp->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum) {
    pIVar11 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_230].idx;
    uVar3 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).scaleExp.data[local_230];
    lVar10 = 0x30;
    for (lVar12 = 0; lVar7 = local_230,
        lVar12 < (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar12 = lVar12 + 1) {
      pNVar4 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x30);
      local_168 = *puVar1;
      uStack_160 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x20);
      local_158 = *puVar1;
      uStack_150 = puVar1[1];
      local_148 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x10);
      local_140 = *(undefined4 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -8);
      local_13c = *(undefined1 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -4);
      local_138 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_168,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)((lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp.data
                            [*(int *)((long)&(pNVar4->val).m_backend.data + lVar10 + 8)] + uVar3),
                 CONCAT31((int3)((uint)local_140 >> 8),local_13c));
      pNVar4 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x10) =
           local_268.data._M_elems._32_8_;
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x20);
      *puVar1 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      puVar1[1] = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      puVar1 = (undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10 + -0x30);
      *puVar1 = CONCAT44(local_268.data._M_elems[1],local_268.data._M_elems[0]);
      puVar1[1] = CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
      *(int *)((long)&(pNVar4->val).m_backend.data + lVar10 + -8) = local_268.exp;
      *(bool *)((long)&(pNVar4->val).m_backend.data + lVar10 + -4) = local_268.neg;
      *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar10) = local_268._48_8_;
      lVar10 = lVar10 + 0x3c;
    }
    pnVar5 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_188 = *(undefined8 *)((long)&pnVar5[local_230].m_backend.data + 0x20);
    local_1a8 = *(undefined8 *)&pnVar5[local_230].m_backend.data;
    uStack_1a0 = *(undefined8 *)((long)&pnVar5[local_230].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar5[local_230].m_backend.data + 0x10);
    local_198 = *(undefined8 *)puVar2;
    uStack_190 = *(undefined8 *)(puVar2 + 2);
    local_180 = pnVar5[local_230].m_backend.exp;
    local_17c = pnVar5[local_230].m_backend.neg;
    local_178._0_4_ = pnVar5[local_230].m_backend.fpclass;
    local_178._4_4_ = pnVar5[local_230].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_268,(soplex *)&local_1a8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)uVar3,CONCAT31((int3)((uint)local_180 >> 8),local_17c));
    pnVar6 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar6[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
    puVar2 = (uint *)((long)&pnVar6[lVar7].m_backend.data + 0x10);
    *puVar2 = local_268.data._M_elems[4];
    puVar2[1] = local_268.data._M_elems[5];
    puVar2[2] = local_268.data._M_elems[6];
    puVar2[3] = local_268.data._M_elems[7];
    pnVar5 = pnVar6 + lVar7;
    (pnVar5->m_backend).data._M_elems[0] = local_268.data._M_elems[0];
    *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_268.data._M_elems[1];
    *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_268.data._M_elems[2];
    *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_268.data._M_elems[3];
    pnVar6[lVar7].m_backend.exp = local_268.exp;
    pnVar6[lVar7].m_backend.neg = local_268.neg;
    pnVar6[lVar7].m_backend.fpclass = local_268.fpclass;
    pnVar6[lVar7].m_backend.prec_elem = local_268.prec_elem;
    pnVar5 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_268,*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator<
                      (pnVar5 + lVar7,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268);
    if (tVar8) {
      pnVar5 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c8 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20);
      local_1e8 = *(undefined8 *)&pnVar5[lVar7].m_backend.data;
      uStack_1e0 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      local_1d8 = *(undefined8 *)puVar2;
      uStack_1d0 = *(undefined8 *)(puVar2 + 2);
      local_1c0 = pnVar5[lVar7].m_backend.exp;
      local_1bc = pnVar5[lVar7].m_backend.neg;
      local_1b8._0_4_ = pnVar5[lVar7].m_backend.fpclass;
      local_1b8._4_4_ = pnVar5[lVar7].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_1e8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-uVar3,CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
      pnVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar6[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar6[lVar7].m_backend.data + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      pnVar5 = pnVar6 + lVar7;
      (pnVar5->m_backend).data._M_elems[0] = local_268.data._M_elems[0];
      *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_268.data._M_elems[1];
      *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_268.data._M_elems[2];
      *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_268.data._M_elems[3];
      pnVar6[lVar7].m_backend.exp = local_268.exp;
      pnVar6[lVar7].m_backend.neg = local_268.neg;
      pnVar6[lVar7].m_backend.fpclass = local_268.fpclass;
      pnVar6[lVar7].m_backend.prec_elem = local_268.prec_elem;
    }
    pnVar5 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_268,-*pdVar9,(type *)0x0);
    tVar8 = boost::multiprecision::operator>
                      (pnVar5 + lVar7,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268);
    if (tVar8) {
      pnVar5 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_208 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20);
      local_228 = *(undefined8 *)&pnVar5[lVar7].m_backend.data;
      uStack_220 = *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      local_218 = *(undefined8 *)puVar2;
      uStack_210 = *(undefined8 *)(puVar2 + 2);
      local_200 = pnVar5[lVar7].m_backend.exp;
      local_1fc = pnVar5[lVar7].m_backend.neg;
      local_1f8._0_4_ = pnVar5[lVar7].m_backend.fpclass;
      local_1f8._4_4_ = pnVar5[lVar7].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_268,(soplex *)&local_228,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-uVar3,CONCAT31((int3)((uint)local_200 >> 8),local_1fc));
      pnVar5 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar5[lVar7].m_backend.data + 0x20) = local_268.data._M_elems._32_8_;
      puVar2 = (uint *)((long)&pnVar5[lVar7].m_backend.data + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_268.data._M_elems[5],local_268.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_268.data._M_elems[7],local_268.data._M_elems[6]);
      *(ulong *)&pnVar5[lVar7].m_backend.data =
           CONCAT44(local_268.data._M_elems[1],local_268.data._M_elems[0]);
      *(ulong *)((long)&pnVar5[lVar7].m_backend.data + 8) =
           CONCAT44(local_268.data._M_elems[3],local_268.data._M_elems[2]);
      pnVar5[lVar7].m_backend.exp = local_268.exp;
      pnVar5[lVar7].m_backend.neg = local_268.neg;
      pnVar5[lVar7].m_backend.fpclass = local_268.fpclass;
      pnVar5[lVar7].m_backend.prec_elem = local_268.prec_elem;
    }
    local_230 = lVar7 + 1;
  }
  lp->_isScaled = true;
  return;
}

Assistant:

void SPxScaler<R>::applyScaling(SPxLPBase<R>& lp)
{
   assert(lp.nCols() == m_activeColscaleExp->size());
   assert(lp.nRows() == m_activeRowscaleExp->size());

   DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);
      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), exp2);

      SPxOut::debug(this, "DEBUG: rowscaleExp({}): {}\n", i, exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);
      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), -exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), -exp2);

      SPxOut::debug(this, "DEBUG: colscaleExp({}): {}\n", i, exp2);
   }

   lp.setScalingInfo(true);
   assert(lp.isConsistent());
}